

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O1

size_t xmi_process_TIMB(PBuffer *buffer,MidiFile *param_2)

{
  byte bVar1;
  byte bVar2;
  element_type *peVar3;
  byte *pbVar4;
  Stream *pSVar5;
  ostream *poVar6;
  undefined1 auStack_88 [16];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ostream *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  peVar3 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar3->endianess = EndianessLittle;
  local_58 = (ostream *)(ulong)*(ushort *)peVar3->read;
  peVar3->read = (uint8_t *)((long)peVar3->read + 2);
  auStack_88._8_8_ = buffer;
  if ((long)local_58 * 2 + 2U == peVar3->size) {
    if (local_58 != (ostream *)0x0) {
      poVar6 = (ostream *)0x0;
      do {
        peVar3 = ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_)->_M_ptr;
        pbVar4 = peVar3->read;
        bVar1 = *pbVar4;
        peVar3->read = pbVar4 + 1;
        bVar2 = pbVar4[1];
        peVar3->read = pbVar4 + 2;
        local_78._M_p = (pointer)&local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"xmi2mid","");
        Log::Logger::operator[]((Logger *)auStack_88,(string *)&Log::Verbose);
        pSVar5 = Log::Stream::operator<<((Stream *)auStack_88,"\tTIMB entry ");
        std::ostream::_M_insert<unsigned_long>((ulong)pSVar5->stream);
        pSVar5 = Log::Stream::operator<<(pSVar5,": ");
        std::ostream::operator<<(pSVar5->stream,(uint)bVar1);
        pSVar5 = Log::Stream::operator<<(pSVar5,", ");
        std::ostream::operator<<(pSVar5->stream,(uint)bVar2);
        Log::Stream::~Stream((Stream *)auStack_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
        poVar6 = poVar6 + 1;
      } while (local_58 != poVar6);
    }
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xmi2mid","");
    Log::Logger::operator[]((Logger *)auStack_88,(string *)&Log::Debug);
    Log::Stream::operator<<((Stream *)auStack_88,"\tInconsistent TIMB block.");
    Log::Stream::~Stream((Stream *)auStack_88);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_)->_M_ptr->size;
}

Assistant:

static size_t
xmi_process_TIMB(PBuffer buffer, MidiFile * /*midi*/) {
  buffer->set_endianess(Buffer::EndianessLittle);
  size_t count = buffer->pop<uint16_t>();
  if (count*2 + 2 != buffer->get_size()) {
    Log::Debug["xmi2mid"] << "\tInconsistent TIMB block.";
  } else {
    for (size_t i = 0; i < count; i++) {
      uint8_t patch = buffer->pop<uint8_t>();
      uint8_t bank = buffer->pop<uint8_t>();
      Log::Verbose["xmi2mid"] << "\tTIMB entry " << i << ": "
                              << static_cast<int>(patch) << ", "
                              << static_cast<int>(bank);
    }
  }
  return buffer->get_size();
}